

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O2

ssize_t __thiscall
ddd::DictionaryMLT<true,_false>::write
          (DictionaryMLT<true,_false> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  void *__buf_00;
  undefined4 in_register_00000034;
  ostream *os;
  size_t i;
  unsigned_long uVar1;
  unsigned_long val;
  
  os = (ostream *)CONCAT44(in_register_00000034,__fd);
  DaTrie<true,_false,_true>::write(*(DaTrie<true,_false,_true> **)(this + 8),__fd,__buf,__n);
  val = *(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3;
  utils::write_value<unsigned_long>(val,os);
  for (uVar1 = 0; val != uVar1; uVar1 = uVar1 + 1) {
    if (*(long *)(*(long *)(this + 0x10) + uVar1 * 8) == 0) {
      utils::write_value<bool>(false,os);
    }
    else {
      utils::write_value<bool>(true,os);
      DaTrie<true,_false,_false>::write
                (*(DaTrie<true,_false,_false> **)(*(long *)(this + 0x10) + uVar1 * 8),__fd,__buf_00,
                 __n);
    }
  }
  utils::write_value<unsigned_int>(*(uint *)(this + 0x28),os);
  utils::write_value<unsigned_long>(*(unsigned_long *)(this + 0x30),os);
  return extraout_RAX;
}

Assistant:

void write(std::ostream& os) const {
    prefix_subtrie_->write(os);
    auto num_suffixes = suffix_subtries_.size();
    utils::write_value(num_suffixes, os);
    for (size_t i = 0; i < num_suffixes; ++i) {
      if (suffix_subtries_[i]) {
        utils::write_value(true, os);
        suffix_subtries_[i]->write(os);
      } else {
        utils::write_value(false, os);
      }
    }
    utils::write_value(suffix_head_, os);
    utils::write_value(num_keys_, os);
  }